

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int tx_get_length(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,size_t *written,
                 _Bool is_elements)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  size_t witness_count;
  size_t witness_size;
  size_t base_size;
  size_t local_30;
  size_t local_28;
  size_t local_20;
  
  iVar3 = -2;
  if (written != (size_t *)0x0) {
    *written = 0;
    iVar1 = tx_get_lengths(tx,opts,flags,&local_20,&local_28,&local_30,is_elements);
    if (iVar1 == 0) {
      if (local_30 != 0) {
        local_30 = local_28;
      }
      iVar3 = 0;
      sVar2 = 0;
      if ((flags & 1) != 0) {
        sVar2 = local_30;
      }
      *written = sVar2 + local_20;
    }
  }
  return iVar3;
}

Assistant:

static int tx_get_length(const struct wally_tx *tx,
                         const struct tx_serialize_opts *opts, uint32_t flags,
                         size_t *written, bool is_elements)
{
    size_t base_size, witness_size, witness_count;

    if (written)
        *written = 0;

    if (!written ||
        tx_get_lengths(tx, opts, flags, &base_size, &witness_size,
                       &witness_count, is_elements) != WALLY_OK)
        return WALLY_EINVAL;

    if (witness_count && (flags & WALLY_TX_FLAG_USE_WITNESS))
        *written = base_size + witness_size;
    else
        *written = base_size;

    return WALLY_OK;
}